

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O1

void __thiscall
cmConfigureLog::WriteLiteralTextBlock(cmConfigureLog *this,string_view key,string_view text)

{
  ofstream *poVar1;
  uint *puVar2;
  char *first;
  byte c;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  uint c32;
  value_type *e;
  uint local_44;
  ulong local_40;
  char *local_38;
  
  pcVar6 = text._M_str;
  uVar5 = text._M_len;
  if (this->Indent != 0) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->Indent);
  }
  poVar1 = &this->Stream;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,key._M_str,
                      key._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": |",3);
  EndLine(this);
  if (uVar5 != 0) {
    puVar2 = &this->Indent;
    *puVar2 = *puVar2 + 1;
    if (*puVar2 != 0) {
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
        uVar7 = uVar7 + 1;
      } while (uVar7 < this->Indent);
    }
    local_38 = pcVar6 + uVar5;
    uVar8 = 0;
    do {
      c = pcVar6[uVar8];
      if (c < 0xd) {
        if (c != 9) {
          if (c == 10) {
            uVar8 = uVar8 + 1;
            if ((uVar8 < uVar5) && (EndLine(this), this->Indent != 0)) {
              uVar7 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
                uVar7 = uVar7 + 1;
              } while (uVar7 < this->Indent);
            }
            goto LAB_004ebaae;
          }
LAB_004eba11:
          if (0x5e < (byte)(c - 0x20)) {
            if ((char)c < '\0') {
              first = pcVar6 + uVar8;
              pcVar4 = cm_utf8_decode_character(first,local_38,&local_44);
              if (0x9f < local_44 && (first <= pcVar4 && (long)pcVar4 - (long)first != 0)) {
                local_40 = (long)pcVar4 - (long)first;
                std::ostream::write((char *)poVar1,(long)first);
                uVar8 = uVar8 + (local_40 & 0xffffffff);
                goto LAB_004ebaae;
              }
            }
            WriteEscape(this,c);
            goto LAB_004ebaab;
          }
        }
        std::ostream::put((char)poVar1);
LAB_004ebaab:
        uVar8 = uVar8 + 1;
      }
      else {
        if (c == 0x5c) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\\\\",2);
          goto LAB_004ebaab;
        }
        if (c != 0xd) goto LAB_004eba11;
        uVar8 = uVar8 + 1;
        if ((uVar8 == uVar5) || (pcVar6[uVar8] != '\n')) {
          WriteEscape(this,'\r');
        }
      }
LAB_004ebaae:
    } while (uVar8 < uVar5);
    EndLine(this);
    this->Indent = this->Indent - 1;
  }
  return;
}

Assistant:

void cmConfigureLog::WriteLiteralTextBlock(cm::string_view key,
                                           cm::string_view text)
{
  this->BeginLine() << key << ": |";
  this->EndLine();

  auto const l = text.length();
  if (l) {
    ++this->Indent;
    this->BeginLine();

    auto i = decltype(l){ 0 };
    while (i < l) {
      // YAML allows ' ', '\t' and "printable characters", but NOT other
      // ASCII whitespace; those must be escaped, as must the upper UNICODE
      // control characters (U+0080 - U+009F)
      static constexpr unsigned int C1_LAST = 0x9F;
      auto const c = static_cast<unsigned char>(text[i]);
      switch (c) {
        case '\r':
          // Print a carriage return only if it is not followed by a line feed.
          ++i;
          if (i == l || text[i] != '\n') {
            this->WriteEscape(c);
          }
          break;
        case '\n':
          // Print any line feeds except the very last one
          if (i + 1 < l) {
            this->EndLine();
            this->BeginLine();
          }
          ++i;
          break;
        case '\t':
          // Print horizontal tab verbatim
          this->Stream.put('\t');
          ++i;
          break;
        case '\\':
          // Escape backslash for disambiguation
          this->Stream << "\\\\";
          ++i;
          break;
        default:
          if (c >= 32 && c < 127) {
            // Print ascii byte.
            this->Stream.put(text[i]);
            ++i;
            break;
          } else if (c > 127) {
            // Decode a UTF-8 sequence.
            unsigned int c32;
            auto const* const s = text.data() + i;
            auto const* const e = text.data() + l;
            auto const* const n = cm_utf8_decode_character(s, e, &c32);
            if (n > s && c32 > C1_LAST) {
              auto const k = std::distance(s, n);
              this->Stream.write(s, static_cast<std::streamsize>(k));
              i += static_cast<unsigned>(k);
              break;
            }
          }

          // Escape non-printable byte.
          this->WriteEscape(c);
          ++i;
          break;
      }
    }

    this->EndLine();
    --this->Indent;
  }
}